

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::DiskSourceTreeTest_NoParent_Test::
~DiskSourceTreeTest_NoParent_Test(DiskSourceTreeTest_NoParent_Test *this)

{
  DiskSourceTreeTest_NoParent_Test *this_local;
  
  ~DiskSourceTreeTest_NoParent_Test(this);
  operator_delete(this,0x68);
  return;
}

Assistant:

TEST_F(DiskSourceTreeTest, NoParent) {
  // Test that we cannot open files in a parent of a mapped directory.

  AddFile(absl::StrCat(dirnames_[0], "/foo"), "Hello World!");
  AddSubdir(absl::StrCat(dirnames_[0], "/bar"));
  AddFile(absl::StrCat(dirnames_[0], "/bar/baz"), "Blah.");
  source_tree_.MapPath("", absl::StrCat(dirnames_[0], "/bar"));

  ExpectFileContents("baz", "Blah.");
  ExpectCannotOpenFile("../foo",
                       "Backslashes, consecutive slashes, \".\", or \"..\" are "
                       "not allowed in the virtual path");
  ExpectCannotOpenFile("../bar/baz",
                       "Backslashes, consecutive slashes, \".\", or \"..\" are "
                       "not allowed in the virtual path");
}